

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O2

void Abc_NtkPrintFanoutProfileVec(Abc_Obj_t *pObj,Vec_Ptr_t *vFanouts)

{
  int iVar1;
  Abc_Obj_t *p;
  char *pcVar2;
  uint i;
  float fVar3;
  float fVar4;
  
  printf("Fanout profile (%d):\n",(ulong)(uint)vFanouts->nSize);
  for (i = 0; (int)i < vFanouts->nSize; i = i + 1) {
    p = (Abc_Obj_t *)Vec_PtrEntry(vFanouts,i);
    fVar3 = Bus_SclObjETime(p);
    fVar4 = Bus_SclObjCin(p);
    printf("%3d : time = %7.2f ps   load = %7.2f ff  ",(double)fVar3,(double)fVar4,(ulong)i);
    if (pObj->pNtk->vPhases != (Vec_Int_t *)0x0) {
      pcVar2 = " ";
      if ((pObj->vFanouts).nSize == vFanouts->nSize) {
        iVar1 = Abc_NodeFindFanin(p,pObj);
        iVar1 = Abc_ObjFaninPhase(p,iVar1);
        pcVar2 = "*";
        if (iVar1 == 0) {
          pcVar2 = " ";
        }
      }
      printf("%s",pcVar2);
    }
    putchar(10);
  }
  putchar(10);
  return;
}

Assistant:

void Abc_NtkPrintFanoutProfileVec( Abc_Obj_t * pObj, Vec_Ptr_t * vFanouts )
{
    Abc_Obj_t * pFanout;
    int i;
    printf( "Fanout profile (%d):\n", Vec_PtrSize(vFanouts) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, i )
    {
        printf( "%3d : time = %7.2f ps   load = %7.2f ff  ", i, Bus_SclObjETime(pFanout), Bus_SclObjCin(pFanout) );
        if ( pObj->pNtk->vPhases )
            printf( "%s", (pObj && Abc_ObjFanoutNum(pObj) == Vec_PtrSize(vFanouts) && Abc_ObjFaninPhase( pFanout, Abc_NodeFindFanin(pFanout, pObj) )) ? "*" : " " );
        printf( "\n" );
    }
    printf( "\n" );
}